

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cxx::SuperClassName_abi_cxx11_
          (string *__return_storage_ptr__,cxx *this,Descriptor *descriptor)

{
  bool bVar1;
  FileDescriptor *file;
  char *__s;
  allocator<char> local_19;
  cxx *local_18;
  Descriptor *descriptor_local;
  
  local_18 = this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  file = Descriptor::file((Descriptor *)this);
  bVar1 = HasDescriptorMethods(file);
  __s = "::google::protobuf::MessageLite";
  if (bVar1) {
    __s = "::google::protobuf::Message";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_19)
  ;
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

string SuperClassName(const Descriptor* descriptor) {
  return HasDescriptorMethods(descriptor->file()) ?
      "::google::protobuf::Message" : "::google::protobuf::MessageLite";
}